

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-routing.c
# Opt level: O1

void mpr_calculate_neighbor_graph_routing(nhdp_domain *domain,neighbor_graph *graph)

{
  int iVar1;
  int iVar2;
  list_entity *plVar3;
  oonf_log_source oVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  list_entity *plVar9;
  ulong uVar10;
  long lVar11;
  netaddr_str nbuf1;
  undefined1 local_6e [62];
  
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x148,0,0,0x937a);
  }
  mpr_init_neighbor_graph(graph,&_rt_api_interface);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0xfa,0,0,0x93a4);
  }
  plVar5 = nhdp_db_get_neigh_list();
  plVar5 = plVar5->next;
  plVar9 = plVar5->prev;
  plVar6 = nhdp_db_get_neigh_list();
  if (plVar9 != plVar6->prev) {
    do {
      *(undefined1 *)((long)&plVar5[-8].prev + 4) = 0;
      if (((*(uint *)&plVar5[(long)domain->index * 2 + 4].prev < 0xffff01) &&
          (0 < *(int *)((long)&plVar5[-9].prev + 4))) &&
         (*(char *)((long)&plVar5[(long)domain->index * 2 + 6].next + 3) != '\0')) {
        uVar10 = (ulong)LOG_MPR;
        if (((&log_global_mask)[uVar10] & 1) != 0) {
          uVar7 = netaddr_to_prefixstring(&nbuf1,&plVar5[-10].prev,0);
          oonf_log(1,uVar10,"src/nhdp/mpr/neighbor-graph-routing.c",0x102,0,0,
                   "Add neighbor %s in: %u",uVar7,
                   (short)*(undefined4 *)&plVar5[(long)domain->index * 2 + 4].prev);
        }
        mpr_add_n1_node_to_set(&graph->set_n1,(nhdp_neighbor *)&plVar5[-10].prev,(nhdp_link *)0x0,0)
        ;
      }
      plVar5 = plVar5->next;
      plVar9 = plVar5->prev;
      plVar6 = nhdp_db_get_neigh_list();
    } while (plVar9 != plVar6->prev);
  }
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x114,0,0,0x93d9);
  }
  plVar5 = (graph->set_n1).list_head.next;
  if (plVar5->prev != (graph->set_n1).list_head.prev) {
    do {
      plVar9 = plVar5[-1].prev[3].prev;
      if (plVar9->prev != plVar5[-1].prev[4].next) {
        do {
          plVar6 = plVar9[-5].prev;
          if (plVar6->prev != plVar9[-4].next) {
            do {
              oVar4 = LOG_MPR;
              lVar11 = (long)domain->index;
              if (*(uint *)((long)&plVar6[7].next + lVar11 * 0xc) < 0xffff01) {
                if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
                  plVar3 = plVar5[-1].prev;
                  uVar7 = netaddr_to_prefixstring(&nbuf1,(netaddr *)(plVar6 + -8),0);
                  uVar8 = netaddr_to_prefixstring(local_6e,&plVar5[-3].prev,0);
                  iVar1 = *(int *)((long)&plVar6[7].next + lVar11 * 0xc);
                  iVar2 = *(int *)((long)&plVar6[7].next + lVar11 * 0xc + 4);
                  oonf_log(1,oVar4,"src/nhdp/mpr/neighbor-graph-routing.c",0x128,0,0,
                           "Add twohop addr %s (over %s) in: %u out: %u (path-in: %u path-out: %u)",
                           uVar7,uVar8,iVar1,iVar2,*(int *)&plVar3[lVar11 * 2 + 0xe].next + iVar1,
                           (short)(*(int *)((long)&plVar3[lVar11 * 2 + 0xe].next + 4) + iVar2));
                }
                mpr_add_addr_node_to_set(&graph->set_n2,*(netaddr *)(plVar6 + -8),0);
              }
              plVar6 = plVar6->next;
            } while (plVar6->prev != plVar9[-4].next);
          }
          plVar9 = plVar9->next;
        } while (plVar9->prev != plVar5[-1].prev[4].next);
      }
      plVar5 = plVar5->next;
    } while (plVar5->prev != (graph->set_n1).list_head.prev);
  }
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_routing(const struct nhdp_domain *domain, struct neighbor_graph *graph) {
  struct neighbor_graph_interface *methods;

  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for routing MPRs");

  methods = _get_neighbor_graph_interface_routing();

  mpr_init_neighbor_graph(graph, methods);
  _calculate_n1(domain, graph);
  _calculate_n2(domain, graph);
}